

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String __thiscall
doctest::detail::stringifyBinaryExpr<long_long,int>(detail *this,longlong *lhs,char *op,int *rhs)

{
  void *local_48;
  String local_40;
  void *local_38;
  String local_30;
  
  toString((doctest *)&local_38,*lhs);
  String::String(&local_40,op);
  String::operator+(&local_30,(String *)&local_38);
  toString((doctest *)&local_48,*rhs);
  String::operator+((String *)this,&local_30);
  free(local_48);
  free(local_30.m_str);
  free(local_40.m_str);
  free(local_38);
  return (String)(char *)this;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return toString(lhs) + op + toString(rhs);
    }